

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::create_global_symtab_lookup_table(CVmImageLoader *this)

{
  CVmObjPageEntry *pCVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  int iVar5;
  vm_runtime_sym *pvVar6;
  vm_val_t str;
  vm_val_t local_38;
  
  if ((this->runtime_symtab_ != (CVmRuntimeSymbols *)0x0) && (this->reflection_symtab_ == 0)) {
    vVar4 = CVmObjLookupTable::create(0,0x100,(uint)this->runtime_symtab_->cnt_);
    this->reflection_symtab_ = vVar4;
    pvVar3 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar4 >> 0xc];
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = vVar4;
    pvVar6 = (vm_runtime_sym *)this->runtime_symtab_;
    while (pvVar6 = pvVar6->nxt, pvVar6 != (vm_runtime_sym *)0x0) {
      if (((pvVar6->val).typ != VM_OBJ) ||
         (iVar5 = CVmObjIntClsMod::is_intcls_mod_obj((pvVar6->val).val.obj), iVar5 == 0)) {
        local_38.val.obj = CVmObjString::create(0,pvVar6->sym,pvVar6->len);
        local_38.typ = VM_OBJ;
        CVmObjLookupTable::add_entry
                  ((CVmObjLookupTable *)(pCVar1 + (vVar4 & 0xfff)),&local_38,&pvVar6->val);
      }
    }
    sp_ = sp_ + -1;
  }
  return;
}

Assistant:

void CVmImageLoader::create_global_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime symbol table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_symtab_ == 0)
        return;

    /* 
     *   if we already have a reflection symbol table, there's no need to
     *   create another 
     */
    if (reflection_symtab_ != VM_INVALID_OBJ)
        return;
    
    /* create a LookupTable to hold the symbols */
    reflection_symtab_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_symtab_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_symtab_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_symtab_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_symtab_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;

        /* 
         *   skip intrinsic class modifier objects (for the same reason we
         *   filter these out of firstObj/nextObj iterations: they're not
         *   meaningful objects as far as the program is concerned, so
         *   there's no reason for the program to see them) 
         */
        if (sym->val.typ == VM_OBJ
            && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ sym->val.val.obj))
        {
            /* it's an intrinsic class modifier - skip it */
            continue;
        }

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* 
         *   add it to the lookup table - the symbol string is the key, and
         *   the symbol's value is the lookup entry value 
         */
        lookup->add_entry(vmg_ &str, &sym->val);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}